

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

bool __thiscall
LLVMBC::ModuleParseContext::parse_metadata_record
          (ModuleParseContext *this,BlockOrRecord *entry,uint index)

{
  long lVar1;
  pointer puVar2;
  uint64_t id;
  LLVMContext *this_00;
  uint64_t *puVar3;
  iterator __position;
  iterator __position_00;
  MetadataKind MVar4;
  MDNode *this_01;
  MDString *pMVar5;
  Value *value;
  ConstantAsMetadata *pCVar6;
  mapped_type *this_02;
  Constant *this_03;
  NamedMDNode *pNVar7;
  mapped_type *ppNVar8;
  mapped_type *ppMVar9;
  LoggingCallback p_Var10;
  void *pvVar11;
  unsigned_long *op;
  pointer puVar12;
  uint64_t *puVar13;
  bool bVar14;
  undefined1 *ptr;
  MDOperand *md;
  Vector<MDOperand_*> ops;
  Constant *local_1040;
  String local_1038 [128];
  
  bVar14 = true;
  switch(entry->id) {
  case 1:
    this_00 = this->context;
    BlockOrRecord::getString_abi_cxx11_(local_1038,entry,0);
    pMVar5 = LLVMContext::
             construct<LLVMBC::MDString,LLVMBC::Module*&,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>
                       (this_00,&this->module,local_1038);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
         *)CONCAT35(local_1038[0]._M_dataplus._M_p._5_3_,(uint5)local_1038[0]._M_dataplus._M_p) !=
        &local_1038[0].field_2) {
      ::dxil_spv::free_in_thread
                ((undefined1 *)
                 CONCAT35(local_1038[0]._M_dataplus._M_p._5_3_,(uint5)local_1038[0]._M_dataplus._M_p
                         ));
    }
    local_1038[0]._M_dataplus._M_p._0_5_ = (uint5)index;
    local_1038[0]._M_dataplus._M_p._5_3_ = 0;
    ppMVar9 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->metadata,(key_type *)local_1038);
    *ppMVar9 = &pMVar5->super_MDOperand;
    return true;
  case 2:
    puVar12 = (entry->ops).
              super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (8 < (ulong)((long)(entry->ops).
                          super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12)) {
      value = get_value(this,puVar12[1],(Type *)0x0,true);
      if (value == (Value *)0x0) {
        p_Var10 = ::dxil_spv::get_thread_log_callback();
        if (p_Var10 != (LoggingCallback)0x0) {
          local_1038[0]._M_string_length._0_5_ = 0xa216575;
          local_1038[0]._M_dataplus._M_p._0_5_ = 0x206c6c754e;
          local_1038[0]._M_dataplus._M_p._5_3_ = 0x6c6176;
          goto LAB_00182d66;
        }
        parse_metadata_record();
      }
      else {
        local_1040 = dyn_cast<LLVMBC::Constant>(value);
        if (local_1040 != (Constant *)0x0) {
          pCVar6 = LLVMContext::
                   construct<LLVMBC::ConstantAsMetadata,LLVMBC::Module*&,LLVMBC::Constant*&>
                             (this->context,&this->module,&local_1040);
          local_1038[0]._M_dataplus._M_p._0_5_ = (uint5)index;
          local_1038[0]._M_dataplus._M_p._5_3_ = 0;
          ppMVar9 = std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&this->metadata,(key_type *)local_1038);
          *ppMVar9 = &pCVar6->super_MDOperand;
          return true;
        }
        p_Var10 = ::dxil_spv::get_thread_log_callback();
        if (p_Var10 == (LoggingCallback)0x0) {
          parse_metadata_record();
        }
        else {
          local_1038[0]._M_dataplus._M_p._0_5_ = 0x6120746f4e;
          local_1038[0]._M_dataplus._M_p._5_3_ = 0x6f6320;
          local_1038[0]._M_string_length._0_5_ = 0x6e6174736e;
          local_1038[0]._M_string_length._5_3_ = 0xa2174;
          local_1038[0].field_2._M_allocated_capacity =
               local_1038[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
LAB_00182d66:
          pvVar11 = ::dxil_spv::get_thread_log_callback_userdata();
          (*p_Var10)(pvVar11,Error,(char *)local_1038);
        }
      }
    }
    break;
  case 3:
  case 5:
    local_1038[0]._M_dataplus._M_p._0_5_ = 0;
    local_1038[0]._M_dataplus._M_p._5_3_ = 0;
    local_1038[0]._M_string_length._0_5_ = 0;
    local_1038[0]._M_string_length._5_3_ = 0;
    local_1038[0].field_2._M_allocated_capacity = (MDNode **)0x0;
    std::vector<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>::reserve
              ((vector<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_> *)
               local_1038,
               (long)(entry->ops).
                     super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(entry->ops).
                     super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
    puVar12 = (entry->ops).
              super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (entry->ops).
             super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (puVar12 != puVar2) {
      do {
        local_1040 = (Constant *)get_metadata(this,*puVar12 - 1);
        __position._M_current._5_3_ = local_1038[0]._M_string_length._5_3_;
        __position._M_current._0_5_ = (undefined5)local_1038[0]._M_string_length;
        if (__position._M_current == (MDOperand **)local_1038[0].field_2._0_8_) {
          std::vector<LLVMBC::MDOperand*,dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand*>>::
          _M_realloc_insert<LLVMBC::MDOperand*const&>
                    ((vector<LLVMBC::MDOperand*,dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand*>>
                      *)local_1038,__position,(MDOperand **)&local_1040);
        }
        else {
          *__position._M_current = (MDOperand *)local_1040;
          lVar1 = CONCAT35(local_1038[0]._M_string_length._5_3_,
                           (undefined5)local_1038[0]._M_string_length) + 8;
          local_1038[0]._M_string_length._0_5_ = (undefined5)lVar1;
          local_1038[0]._M_string_length._5_3_ = (undefined3)((ulong)lVar1 >> 0x28);
        }
        puVar12 = puVar12 + 1;
      } while (puVar12 != puVar2);
    }
    this_01 = LLVMContext::
              construct<LLVMBC::MDNode,LLVMBC::Module*&,std::vector<LLVMBC::MDOperand*,dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand*>>>
                        (this->context,&this->module,
                         (vector<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>
                          *)local_1038);
    id = this->metadata_tween_id;
    this->metadata_tween_id = id + 1;
    MDNode::set_tween_id(this_01,id);
    Module::add_unnamed_metadata(this->module,this_01);
    local_1040 = (Constant *)(ulong)index;
    ppMVar9 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->metadata,(key_type *)&local_1040);
    *ppMVar9 = &this_01->super_MDOperand;
    ptr = (undefined1 *)
          CONCAT35(local_1038[0]._M_dataplus._M_p._5_3_,(uint5)local_1038[0]._M_dataplus._M_p);
    goto joined_r0x00182d08;
  case 4:
    BlockOrRecord::getString_abi_cxx11_(local_1038,entry,0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::operator=(&this->current_metadata_name,local_1038);
    ptr = (undefined1 *)
          CONCAT35(local_1038[0]._M_dataplus._M_p._5_3_,(uint5)local_1038[0]._M_dataplus._M_p);
LAB_00182db6:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
         *)ptr == &local_1038[0].field_2) {
      return true;
    }
    goto LAB_00182d0a;
  case 6:
    if ((entry->ops).
        super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (entry->ops).
        super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      BlockOrRecord::getString_abi_cxx11_(local_1038,entry,1);
      this_02 = std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->metadata_kind_map,
                             (entry->ops).
                             super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                             ._M_impl.super__Vector_impl_data._M_start);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::operator=
                (this_02,local_1038);
      ptr = (undefined1 *)
            CONCAT35(local_1038[0]._M_dataplus._M_p._5_3_,(uint5)local_1038[0]._M_dataplus._M_p);
      goto LAB_00182db6;
    }
    break;
  default:
    goto switchD_001829fc_caseD_7;
  case 10:
    local_1038[0]._M_dataplus._M_p._0_5_ = 0;
    local_1038[0]._M_dataplus._M_p._5_3_ = 0;
    local_1038[0]._M_string_length._0_5_ = 0;
    local_1038[0]._M_string_length._5_3_ = 0;
    local_1038[0].field_2._M_allocated_capacity = (MDNode **)0x0;
    std::vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>::reserve
              ((vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_> *)
               local_1038,
               (long)(entry->ops).
                     super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(entry->ops).
                     super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
    puVar13 = (entry->ops).
              super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (entry->ops).
             super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (puVar13 != puVar3) {
      do {
        this_03 = (Constant *)get_metadata(this,*puVar13);
        if (this_03 == (Constant *)0x0) {
          local_1040 = (Constant *)0x0;
        }
        else {
          MVar4 = MDOperand::get_metadata_kind((MDOperand *)this_03);
          local_1040 = this_03;
          if (MVar4 != Node) {
            local_1040 = (Constant *)0x0;
          }
        }
        __position_00._M_current._5_3_ = local_1038[0]._M_string_length._5_3_;
        __position_00._M_current._0_5_ = (undefined5)local_1038[0]._M_string_length;
        if (__position_00._M_current == (MDNode **)local_1038[0].field_2._0_8_) {
          std::vector<LLVMBC::MDNode*,dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode*>>::
          _M_realloc_insert<LLVMBC::MDNode*const&>
                    ((vector<LLVMBC::MDNode*,dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode*>> *)
                     local_1038,__position_00,(MDNode **)&local_1040);
        }
        else {
          *__position_00._M_current = (MDNode *)local_1040;
          lVar1 = CONCAT35(local_1038[0]._M_string_length._5_3_,
                           (undefined5)local_1038[0]._M_string_length) + 8;
          local_1038[0]._M_string_length._0_5_ = (undefined5)lVar1;
          local_1038[0]._M_string_length._5_3_ = (undefined3)((ulong)lVar1 >> 0x28);
        }
        puVar13 = puVar13 + 1;
      } while (puVar13 != puVar3);
    }
    pNVar7 = LLVMContext::
             construct<LLVMBC::NamedMDNode,LLVMBC::Module*&,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>&,std::vector<LLVMBC::MDNode*,dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode*>>>
                       (this->context,&this->module,&this->current_metadata_name,
                        (vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>
                         *)local_1038);
    ppNVar8 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::NamedMDNode_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::NamedMDNode_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::NamedMDNode_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::NamedMDNode_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->module->named_metadata,&this->current_metadata_name);
    *ppNVar8 = pNVar7;
    local_1040 = (Constant *)(ulong)index;
    ppMVar9 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->metadata,(key_type *)&local_1040);
    *ppMVar9 = &pNVar7->super_MDOperand;
    ptr = (undefined1 *)
          CONCAT35(local_1038[0]._M_dataplus._M_p._5_3_,(uint5)local_1038[0]._M_dataplus._M_p);
joined_r0x00182d08:
    bVar14 = true;
    if (ptr != (undefined1 *)0x0) {
LAB_00182d0a:
      bVar14 = true;
      ::dxil_spv::free_in_thread(ptr);
    }
    goto switchD_001829fc_caseD_7;
  }
  bVar14 = false;
switchD_001829fc_caseD_7:
  return bVar14;
}

Assistant:

bool ModuleParseContext::parse_metadata_record(const BlockOrRecord &entry, unsigned index)
{
	switch (MetaDataRecord(entry.id))
	{
	case MetaDataRecord::NAME:
	{
		current_metadata_name = entry.getString();
		break;
	}

	case MetaDataRecord::NAMED_NODE:
	{
		Vector<MDNode *> ops;
		ops.reserve(entry.ops.size());
		for (auto &op : entry.ops)
		{
			auto *md = get_metadata(op);
			auto *node = dyn_cast<MDNode>(md);
			ops.push_back(node);
		}

		auto *node = context->construct<NamedMDNode>(module, current_metadata_name, std::move(ops));
		module->add_named_metadata(current_metadata_name, node);
		metadata[index] = node;
		break;
	}

	case MetaDataRecord::DISTINCT_NODE:
	case MetaDataRecord::NODE:
	{
		Vector<MDOperand *> ops;
		ops.reserve(entry.ops.size());
		for (auto &op : entry.ops)
		{
			// For some reason, here metadata is indexed with -1?
			auto *md = get_metadata(op - 1);
			ops.push_back(md);
		}

		auto *node = context->construct<MDNode>(module, std::move(ops));
		node->set_tween_id(metadata_tween_id++);
		module->add_unnamed_metadata(node);
		metadata[index] = node;
		break;
	}

	case MetaDataRecord::STRING_OLD:
	{
		auto *node = context->construct<MDString>(module, entry.getString());
		metadata[index] = node;
		break;
	}

	case MetaDataRecord::VALUE:
	{
		if (entry.ops.size() < 2)
			return false;

		auto *value = get_value(entry.ops[1], nullptr, true);
		if (!value)
		{
			LOGE("Null value!\n");
			return false;
		}

		auto *constant_value = dyn_cast<Constant>(value);
		if (!constant_value)
		{
			LOGE("Not a constant!\n");
			return false;
		}

		auto *node = context->construct<ConstantAsMetadata>(module, constant_value);
		metadata[index] = node;
		break;
	}

	case MetaDataRecord::KIND:
	{
		if (entry.ops.size() < 1)
			return false;

		metadata_kind_map[entry.ops[0]] = entry.getString(1);
		break;
	}

	default:
		break;
	}

	return true;
}